

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

cake_iterator<false> * __thiscall
skiplist<int,_std::less<int>_>::cake_iterator<false>::operator++(cake_iterator<false> *this)

{
  SLNode<int> *pSVar1;
  int iVar2;
  
  if (this->node_count_ == 0) {
    pSVar1 = (&this->node->back)[this->reverse_ ^ 1];
    this->node = pSVar1;
    if (pSVar1 != (SLNode<int> *)0x0) {
      iVar2 = pSVar1->count + -1;
      this->node_count_ = iVar2;
      this->node_count_ref_ = iVar2;
      return this;
    }
  }
  else {
    this->node_count_ = this->node_count_ + -1;
  }
  return this;
}

Assistant:

const cake_iterator& operator++() {
        if(node_count_ != 0) {
            --node_count_;
            return *this;
        }
        if(reverse_)
            node = node->back;
        else
            node = node->next;
        if(node) {
            node_count_ = node->count - 1;
            node_count_ref_ = node_count_;
        }
        return *this;
    }